

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O3

void dxil_spv::update_raw_access_tracking_from_vector_type
               (AccessTracking *tracking,Type *type,RawVecSize vec_size)

{
  TypeID TVar1;
  uint uVar2;
  long lVar3;
  
  TVar1 = LLVMBC::Type::getTypeID(type);
  lVar3 = 9;
  if (TVar1 != HalfTyID) {
    TVar1 = LLVMBC::Type::getTypeID(type);
    lVar3 = 0xd;
    if (TVar1 != FloatTyID) {
      TVar1 = LLVMBC::Type::getTypeID(type);
      lVar3 = 0x21;
      if (TVar1 != DoubleTyID) {
        TVar1 = LLVMBC::Type::getTypeID(type);
        if (TVar1 != IntegerTyID) {
          return;
        }
        uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
        lVar3 = 9;
        if (uVar2 != 0x10) {
          uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
          lVar3 = 0xd;
          if (uVar2 != 0x20) {
            uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
            lVar3 = 0x11;
            if (uVar2 != 0x40) {
              return;
            }
          }
        }
      }
    }
  }
  *(undefined1 *)
   ((long)(tracking->raw_access_buffer_declarations + -1) + 0xb + (int)vec_size + lVar3) = 1;
  return;
}

Assistant:

static void update_raw_access_tracking_from_vector_type(Converter::Impl::AccessTracking &tracking,
                                                        const llvm::Type *type, RawVecSize vec_size)
{
	// For SSBOs, always use uint types, except for 64-bit since Float64 vs Int64 are two separate features.
	if (type->getTypeID() == llvm::Type::TypeID::HalfTyID)
		tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B16)][int(vec_size)] = true;
	else if (type->getTypeID() == llvm::Type::TypeID::FloatTyID)
		tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B32)][int(vec_size)] = true;
	else if (type->getTypeID() == llvm::Type::TypeID::DoubleTyID)
		tracking.raw_access_buffer_declarations[int(RawType::Float)][int(RawWidth::B64)][int(vec_size)] = true;
	else if (type->getTypeID() == llvm::Type::TypeID::IntegerTyID)
	{
		if (type->getIntegerBitWidth() == 16)
			tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B16)][int(vec_size)] = true;
		else if (type->getIntegerBitWidth() == 32)
			tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B32)][int(vec_size)] = true;
		else if (type->getIntegerBitWidth() == 64)
			tracking.raw_access_buffer_declarations[int(RawType::Integer)][int(RawWidth::B64)][int(vec_size)] = true;
	}
}